

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemm4xN<3>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  long lVar2;
  __m256 c;
  __m256 c_00;
  __m256 c_01;
  __m256 c_02;
  __m256 x;
  __m256i s;
  __m256 b;
  __m256i s_00;
  __m256 b_00;
  __m256i s_01;
  __m256 b_01;
  __m256i s_02;
  __m256 b_02;
  __m256i u;
  __m256 a;
  __m256i u_00;
  __m256 a_00;
  __m256i u_01;
  __m256 a_01;
  __m256i u_02;
  __m256 a_02;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RCX;
  long in_RDX;
  block_q8_0 *b_03;
  long in_RSI;
  __m256i *in_RDI;
  long in_R8;
  float fVar6;
  longlong lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *ptVar18;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  block_q5_0 *pbVar17;
  longlong lVar19;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int64_t i;
  int64_t j_1;
  __m256 dvec;
  __m128 db;
  int64_t j;
  __m256i avec3;
  __m256i avec2;
  __m256i avec1;
  __m256i avec0;
  __m128 da;
  uint64_t a_delta;
  int64_t l;
  __m256 Cv [3] [4];
  int64_t jj;
  int64_t ii;
  int64_t job;
  int64_t end;
  int64_t start;
  int64_t duty;
  int64_t tiles;
  int64_t xtiles;
  int64_t ytiles;
  undefined1 in_stack_fffffffffffff920 [24];
  undefined8 uVar20;
  longlong lVar21;
  block_q5_0 *in_stack_fffffffffffff948;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_fffffffffffff950;
  longlong lVar22;
  undefined1 in_stack_fffffffffffff960 [24];
  longlong local_680;
  longlong lStack_678;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this_00;
  longlong lStack_668;
  longlong local_640;
  longlong lStack_638;
  longlong lStack_630;
  longlong lStack_628;
  longlong local_600;
  longlong lStack_5f8;
  longlong lStack_5f0;
  longlong lStack_5e8;
  long local_5b0;
  long local_5a8;
  undefined1 local_5a0 [20];
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  block_q8_0 *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  long local_4c8;
  longlong local_4c0 [50];
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e0;
  long local_2d0;
  ulong local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  ulong local_2a0;
  undefined8 local_298;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_274;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined1 auVar10 [32];
  
  local_2f0 = (in_RDX - in_RSI) / 4;
  local_2f8 = (in_R8 - in_RCX) / 3;
  local_300 = local_2f8 * local_2f0;
  local_308 = (local_300 + *(int *)((long)in_RDI[1] + 0x1c) + -1) /
              (long)*(int *)((long)in_RDI[1] + 0x1c);
  local_320 = local_308 * (int)in_RDI[1][3];
  local_318 = local_320 + local_308;
  local_310 = local_320;
  local_2e0 = in_RCX;
  local_2d0 = in_RSI;
  if (local_300 < local_320 + local_308) {
    local_318 = local_300;
  }
  for (; local_320 < local_318; local_320 = local_320 + 1) {
    local_328 = local_2d0 + (local_320 / local_2f8) * 4;
    local_330 = local_2e0 + (local_320 % local_2f8) * 3;
    memset(local_4c0,0,0x180);
    for (local_4c8 = 0; local_4c8 < (*in_RDI)[3]; local_4c8 = local_4c8 + 1) {
      lVar1 = (*in_RDI)[0];
      lVar2 = in_RDI[1][0];
      local_2a0 = (ulong)*(ushort *)(lVar1 + (lVar2 * (local_328 + 3) + local_4c8) * 0x16) << 0x30 |
                  (ulong)*(ushort *)(lVar1 + (lVar2 * (local_328 + 2) + local_4c8) * 0x16) << 0x20 |
                  (ulong)*(ushort *)(lVar1 + (lVar2 * (local_328 + 1) + local_4c8) * 0x16) << 0x10 |
                  (ulong)*(ushort *)(lVar1 + (lVar2 * local_328 + local_4c8) * 0x16);
      local_298 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_2a0;
      local_2b0 = vpunpcklqdq_avx(auVar8,ZEXT816(0));
      local_2c0 = local_2b0._0_8_;
      uStack_2b8 = local_2b0._8_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_2b0._0_8_;
      auVar8 = vcvtph2ps_f16c(auVar9);
      auVar10 = ZEXT1632(auVar8);
      load(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      auVar11 = auVar10;
      load(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      auVar12 = auVar11;
      load(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      auVar13 = auVar12;
      load(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      for (local_568 = (block_q8_0 *)0x0; auVar14 = _local_5a0, (long)local_568 < 3;
          local_568 = (block_q8_0 *)((long)&local_568->d + 1)) {
        local_290 = unhalf(0);
        local_260 = CONCAT44(local_290,local_290);
        uStack_258 = CONCAT44(local_290,local_290);
        local_4e0 = auVar8._0_8_;
        uStack_4d8 = auVar8._8_8_;
        local_250 = local_4e0;
        uVar4 = local_250;
        uStack_248 = uStack_4d8;
        uVar5 = uStack_248;
        local_250._0_4_ = auVar8._0_4_;
        local_250._4_4_ = auVar8._4_4_;
        uStack_248._0_4_ = auVar8._8_4_;
        uStack_248._4_4_ = auVar8._12_4_;
        local_270 = (float)local_250 * local_290;
        fStack_26c = local_250._4_4_ * local_290;
        fStack_268 = (float)uStack_248 * local_290;
        fStack_264 = uStack_248._4_4_ * local_290;
        local_5a0._4_4_ = fStack_26c;
        local_5a0._0_4_ = local_270;
        uVar20 = local_5a0._0_8_;
        local_5a0._12_4_ = fStack_264;
        local_5a0._8_4_ = fStack_268;
        uVar3 = local_5a0._8_8_;
        local_5a0._0_16_ = auVar14._0_16_;
        local_5a0._16_4_ = local_290;
        fStack_58c = local_290;
        fStack_588 = local_290;
        fStack_584 = local_290;
        local_5a0._0_16_ = CONCAT88(uVar3,uVar20);
        _local_5a0 = vpermpd_avx2(_local_5a0,0x44);
        auVar14 = vpermilps_avx(_local_5a0,0);
        lVar7 = auVar14._0_8_;
        pbVar17 = auVar14._8_8_;
        ptVar18 = auVar14._16_8_;
        lVar19 = auVar14._24_8_;
        local_500 = auVar10._0_8_;
        uStack_4f8 = auVar10._8_8_;
        uStack_4f0 = auVar10._16_8_;
        uStack_4e8 = auVar10._24_8_;
        local_60 = local_500;
        uStack_58 = uStack_4f8;
        uStack_50 = uStack_4f0;
        uStack_48 = uStack_4e8;
        local_80 = local_500;
        uStack_78 = uStack_4f8;
        uStack_70 = uStack_4f0;
        uStack_68 = uStack_4e8;
        auVar14 = vpsignb_avx2(auVar10,auVar10);
        in_stack_fffffffffffff920 = auVar14._0_24_;
        uVar20 = auVar14._24_8_;
        fStack_28c = local_290;
        fStack_288 = local_290;
        fStack_284 = local_290;
        local_274 = local_290;
        local_250 = uVar4;
        uStack_248 = uVar5;
        load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                    ((*in_RDI)[1] + in_RDI[1][1] * (long)(local_568->qs + local_330 + -2) * 0x22 +
                    local_4c8 * 0x22),local_568);
        local_c0 = local_500;
        uStack_b8 = uStack_4f8;
        uStack_b0 = uStack_4f0;
        uStack_a8 = uStack_4e8;
        vpsignb_avx2(auVar14,auVar10);
        u[1] = in_stack_fffffffffffff960._0_8_;
        u[2] = in_stack_fffffffffffff960._8_8_;
        u[3] = in_stack_fffffffffffff960._16_8_;
        u[0] = lVar19;
        s[1] = lVar7;
        s[0] = uVar20;
        s[2] = (longlong)pbVar17;
        s[3] = (longlong)ptVar18;
        local_a0 = auVar14;
        updot(this_00,u,s);
        a[2] = (float)in_stack_fffffffffffff960._0_4_;
        a[3] = (float)in_stack_fffffffffffff960._4_4_;
        a[4] = (float)in_stack_fffffffffffff960._8_4_;
        a[5] = (float)in_stack_fffffffffffff960._12_4_;
        a[6] = (float)in_stack_fffffffffffff960._16_4_;
        a[7] = (float)in_stack_fffffffffffff960._20_4_;
        a[0] = (float)(int)lVar19;
        a[1] = (float)(int)((ulong)lVar19 >> 0x20);
        b[2] = (float)(int)lVar7;
        b[3] = (float)(int)((ulong)lVar7 >> 0x20);
        b[0] = (float)(int)uVar20;
        b[1] = (float)(int)((ulong)uVar20 >> 0x20);
        b._16_8_ = pbVar17;
        b._24_8_ = ptVar18;
        c[2] = (float)in_stack_fffffffffffff920._0_4_;
        c[3] = (float)in_stack_fffffffffffff920._4_4_;
        c[4] = (float)in_stack_fffffffffffff920._8_4_;
        c[5] = (float)in_stack_fffffffffffff920._12_4_;
        c[6] = (float)in_stack_fffffffffffff920._16_4_;
        c[7] = (float)in_stack_fffffffffffff920._20_4_;
        c[0] = 2.753519e-39;
        c[1] = 0.0;
        lVar21 = lVar7;
        in_stack_fffffffffffff948 = pbVar17;
        in_stack_fffffffffffff950 = ptVar18;
        lVar22 = lVar19;
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a,b,c);
        local_4c0[(long)local_568 * 0x10] = lVar7;
        local_4c0[(long)local_568 * 0x10 + 1] = (longlong)pbVar17;
        local_4c0[(long)local_568 * 0x10 + 2] = (longlong)ptVar18;
        local_4c0[(long)local_568 * 0x10 + 3] = lVar19;
        auVar14 = vpermilps_avx(_local_5a0,0x55);
        local_520 = auVar11._0_8_;
        uStack_518 = auVar11._8_8_;
        uStack_510 = auVar11._16_8_;
        uStack_508 = auVar11._24_8_;
        local_e0 = local_520;
        uStack_d8 = uStack_518;
        uStack_d0 = uStack_510;
        uStack_c8 = uStack_508;
        local_100 = local_520;
        uStack_f8 = uStack_518;
        uStack_f0 = uStack_510;
        uStack_e8 = uStack_508;
        auVar15 = vpsignb_avx2(auVar11,auVar11);
        in_stack_fffffffffffff960 = auVar15._0_24_;
        load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                    ((*in_RDI)[1] + in_RDI[1][1] * (long)(local_568->qs + local_330 + -2) * 0x22 +
                    local_4c8 * 0x22),local_568);
        local_140 = local_520;
        uStack_138 = uStack_518;
        uStack_130 = uStack_510;
        uStack_128 = uStack_508;
        vpsignb_avx2(auVar15,auVar11);
        this_00 = auVar14._16_8_;
        u_00[1] = in_stack_fffffffffffff960._0_8_;
        u_00[2] = in_stack_fffffffffffff960._8_8_;
        u_00[3] = in_stack_fffffffffffff960._16_8_;
        u_00[0] = lVar22;
        s_00[1] = lVar21;
        s_00[0] = uVar20;
        s_00[2] = (longlong)in_stack_fffffffffffff948;
        s_00[3] = (longlong)in_stack_fffffffffffff950;
        local_120 = auVar15;
        updot(this_00,u_00,s_00);
        local_680 = auVar14._0_8_;
        lStack_678 = auVar14._8_8_;
        lStack_668 = auVar14._24_8_;
        a_00[2] = (float)in_stack_fffffffffffff960._0_4_;
        a_00[3] = (float)in_stack_fffffffffffff960._4_4_;
        a_00[4] = (float)in_stack_fffffffffffff960._8_4_;
        a_00[5] = (float)in_stack_fffffffffffff960._12_4_;
        a_00[6] = (float)in_stack_fffffffffffff960._16_4_;
        a_00[7] = (float)in_stack_fffffffffffff960._20_4_;
        a_00[0] = (float)(int)lVar22;
        a_00[1] = (float)(int)((ulong)lVar22 >> 0x20);
        b_00[2] = (float)(int)lVar21;
        b_00[3] = (float)(int)((ulong)lVar21 >> 0x20);
        b_00[0] = (float)(int)uVar20;
        b_00[1] = (float)(int)((ulong)uVar20 >> 0x20);
        b_00._16_8_ = in_stack_fffffffffffff948;
        b_00._24_8_ = in_stack_fffffffffffff950;
        c_00[2] = (float)in_stack_fffffffffffff920._0_4_;
        c_00[3] = (float)in_stack_fffffffffffff920._4_4_;
        c_00[4] = (float)in_stack_fffffffffffff920._8_4_;
        c_00[5] = (float)in_stack_fffffffffffff920._12_4_;
        c_00[6] = (float)in_stack_fffffffffffff920._16_4_;
        c_00[7] = (float)in_stack_fffffffffffff920._20_4_;
        c_00[0] = 2.753921e-39;
        c_00[1] = 0.0;
        ptVar18 = this_00;
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a_00,b_00,c_00);
        local_4c0[(long)local_568 * 0x10 + 4] = local_680;
        local_4c0[(long)local_568 * 0x10 + 5] = lStack_678;
        local_4c0[(long)local_568 * 0x10 + 6] = (longlong)ptVar18;
        local_4c0[(long)local_568 * 0x10 + 7] = lStack_668;
        auVar15 = vpermilps_avx(_local_5a0,0xaa);
        local_540 = auVar12._0_8_;
        uStack_538 = auVar12._8_8_;
        uStack_530 = auVar12._16_8_;
        uStack_528 = auVar12._24_8_;
        local_160 = local_540;
        uStack_158 = uStack_538;
        uStack_150 = uStack_530;
        uStack_148 = uStack_528;
        local_180 = local_540;
        uStack_178 = uStack_538;
        uStack_170 = uStack_530;
        uStack_168 = uStack_528;
        auVar16 = vpsignb_avx2(auVar12,auVar12);
        load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                    ((*in_RDI)[1] + in_RDI[1][1] * (long)(local_568->qs + local_330 + -2) * 0x22 +
                    local_4c8 * 0x22),local_568);
        local_1c0 = local_540;
        uStack_1b8 = uStack_538;
        uStack_1b0 = uStack_530;
        uStack_1a8 = uStack_528;
        vpsignb_avx2(auVar16,auVar12);
        u_01[1] = in_stack_fffffffffffff960._0_8_;
        u_01[2] = in_stack_fffffffffffff960._8_8_;
        u_01[3] = in_stack_fffffffffffff960._16_8_;
        u_01[0] = lVar22;
        s_01[1] = lVar21;
        s_01[0] = uVar20;
        s_01[2] = (longlong)in_stack_fffffffffffff948;
        s_01[3] = (longlong)in_stack_fffffffffffff950;
        local_1a0 = auVar16;
        updot(this_00,u_01,s_01);
        local_640 = auVar15._0_8_;
        lStack_638 = auVar15._8_8_;
        lStack_630 = auVar15._16_8_;
        lStack_628 = auVar15._24_8_;
        a_01[2] = (float)in_stack_fffffffffffff960._0_4_;
        a_01[3] = (float)in_stack_fffffffffffff960._4_4_;
        a_01[4] = (float)in_stack_fffffffffffff960._8_4_;
        a_01[5] = (float)in_stack_fffffffffffff960._12_4_;
        a_01[6] = (float)in_stack_fffffffffffff960._16_4_;
        a_01[7] = (float)in_stack_fffffffffffff960._20_4_;
        a_01[0] = (float)(int)lVar22;
        a_01[1] = (float)(int)((ulong)lVar22 >> 0x20);
        b_01[2] = (float)(int)lVar21;
        b_01[3] = (float)(int)((ulong)lVar21 >> 0x20);
        b_01[0] = (float)(int)uVar20;
        b_01[1] = (float)(int)((ulong)uVar20 >> 0x20);
        b_01._16_8_ = in_stack_fffffffffffff948;
        b_01._24_8_ = in_stack_fffffffffffff950;
        c_01[2] = (float)in_stack_fffffffffffff920._0_4_;
        c_01[3] = (float)in_stack_fffffffffffff920._4_4_;
        c_01[4] = (float)in_stack_fffffffffffff920._8_4_;
        c_01[5] = (float)in_stack_fffffffffffff920._12_4_;
        c_01[6] = (float)in_stack_fffffffffffff920._16_4_;
        c_01[7] = (float)in_stack_fffffffffffff920._20_4_;
        c_01[0] = 2.75434e-39;
        c_01[1] = 0.0;
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a_01,b_01,c_01);
        local_4c0[(long)local_568 * 0x10 + 8] = local_640;
        local_4c0[(long)local_568 * 0x10 + 9] = lStack_638;
        local_4c0[(long)local_568 * 0x10 + 10] = lStack_630;
        local_4c0[(long)local_568 * 0x10 + 0xb] = lStack_628;
        auVar15 = vpermilps_avx(_local_5a0,0xff);
        local_560 = auVar13._0_8_;
        uStack_558 = auVar13._8_8_;
        uStack_550 = auVar13._16_8_;
        uStack_548 = auVar13._24_8_;
        local_1e0 = local_560;
        uStack_1d8 = uStack_558;
        uStack_1d0 = uStack_550;
        uStack_1c8 = uStack_548;
        local_200 = local_560;
        uStack_1f8 = uStack_558;
        uStack_1f0 = uStack_550;
        uStack_1e8 = uStack_548;
        auVar16 = vpsignb_avx2(auVar13,auVar13);
        load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                    ((*in_RDI)[1] + in_RDI[1][1] * (long)(local_568->qs + local_330 + -2) * 0x22 +
                    local_4c8 * 0x22),b_03);
        local_240 = local_560;
        uStack_238 = uStack_558;
        uStack_230 = uStack_550;
        uStack_228 = uStack_548;
        vpsignb_avx2(auVar16,auVar13);
        u_02[1] = in_stack_fffffffffffff960._0_8_;
        u_02[2] = in_stack_fffffffffffff960._8_8_;
        u_02[3] = in_stack_fffffffffffff960._16_8_;
        u_02[0] = lVar22;
        s_02[1] = lVar21;
        s_02[0] = uVar20;
        s_02[2] = (longlong)in_stack_fffffffffffff948;
        s_02[3] = (longlong)in_stack_fffffffffffff950;
        local_220 = auVar16;
        updot(this_00,u_02,s_02);
        local_600 = auVar15._0_8_;
        lStack_5f8 = auVar15._8_8_;
        lStack_5f0 = auVar15._16_8_;
        lStack_5e8 = auVar15._24_8_;
        a_02[2] = (float)in_stack_fffffffffffff960._0_4_;
        a_02[3] = (float)in_stack_fffffffffffff960._4_4_;
        a_02[4] = (float)in_stack_fffffffffffff960._8_4_;
        a_02[5] = (float)in_stack_fffffffffffff960._12_4_;
        a_02[6] = (float)in_stack_fffffffffffff960._16_4_;
        a_02[7] = (float)in_stack_fffffffffffff960._20_4_;
        a_02[0] = (float)(int)lVar22;
        a_02[1] = (float)(int)((ulong)lVar22 >> 0x20);
        b_02[2] = (float)(int)lVar21;
        b_02[3] = (float)(int)((ulong)lVar21 >> 0x20);
        b_02[0] = (float)(int)uVar20;
        b_02[1] = (float)(int)((ulong)uVar20 >> 0x20);
        b_02._16_8_ = in_stack_fffffffffffff948;
        b_02._24_8_ = in_stack_fffffffffffff950;
        c_02[2] = (float)in_stack_fffffffffffff920._0_4_;
        c_02[3] = (float)in_stack_fffffffffffff920._4_4_;
        c_02[4] = (float)in_stack_fffffffffffff920._8_4_;
        c_02[5] = (float)in_stack_fffffffffffff920._12_4_;
        c_02[6] = (float)in_stack_fffffffffffff920._16_4_;
        c_02[7] = (float)in_stack_fffffffffffff920._20_4_;
        c_02[0] = 2.754754e-39;
        c_02[1] = 0.0;
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a_02,b_02,c_02);
        local_4c0[(long)local_568 * 0x10 + 0xc] = local_600;
        local_4c0[(long)local_568 * 0x10 + 0xd] = lStack_5f8;
        local_4c0[(long)local_568 * 0x10 + 0xe] = lStack_5f0;
        local_4c0[(long)local_568 * 0x10 + 0xf] = lStack_5e8;
        _local_680 = auVar14;
      }
    }
    for (local_5a8 = 0; local_5a8 < 3; local_5a8 = local_5a8 + 1) {
      for (local_5b0 = 0; local_5b0 < 4; local_5b0 = local_5b0 + 1) {
        x[2] = (float)in_stack_fffffffffffff920._0_4_;
        x[3] = (float)in_stack_fffffffffffff920._4_4_;
        x[4] = (float)in_stack_fffffffffffff920._8_4_;
        x[5] = (float)in_stack_fffffffffffff920._12_4_;
        x[6] = (float)in_stack_fffffffffffff920._16_4_;
        x[7] = (float)in_stack_fffffffffffff920._20_4_;
        x[0] = 2.755007e-39;
        x[1] = 0.0;
        fVar6 = hsum(x);
        *(float *)((*in_RDI)[2] +
                  (in_RDI[1][2] * (local_330 + local_5a8) + local_328 + local_5b0) * 4) = fVar6;
      }
    }
  }
  return;
}

Assistant:

NOINLINE void gemm4xN(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / 4;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * 4;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][4] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t a_delta = ((uint64_t)A[lda * (ii + 3) + l].d << 48) | ((uint64_t)A[lda * (ii + 2) + l].d << 32) | ((uint64_t)A[lda * (ii + 1) + l].d << 16) | (A[lda * (ii + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 da = _mm_cvtph_ps(_mm_set_epi64x(0, a_delta));
                __m256i avec0 = load(A + lda * (ii + 0) + l);
                __m256i avec1 = load(A + lda * (ii + 1) + l);
                __m256i avec2 = load(A + lda * (ii + 2) + l);
                __m256i avec3 = load(A + lda * (ii + 3) + l);
                for (int64_t j = 0; j < RN; ++j) {
                        __m128 db = _mm_set1_ps(unhalf(B[ldb * (jj + j) + l].d));
                        // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                        __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                        dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                        // Computation of dot product and multiplication with appropriate delta value products
                        Cv[j][0] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(avec0, avec0),
                                          _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec0)),
                                    Cv[j][0]);
                        Cv[j][1] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(avec1, avec1),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec1)),
                                    Cv[j][1]);
                        Cv[j][2] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(avec2, avec2),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec2)),
                                    Cv[j][2]);
                        Cv[j][3] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(avec3, avec3),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec3)),
                                    Cv[j][3]);
                }
            }

            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < 4; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }